

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O0

int EVP_DecodeBlock(uchar *t,uchar *f,int n)

{
  uint uVar1;
  int iVar2;
  undefined4 in_register_00000014;
  ulong local_30;
  size_t dst_len;
  size_t src_len_local;
  uint8_t *src_local;
  uint8_t *dst_local;
  
  dst_len = CONCAT44(in_register_00000014,n);
  for (src_len_local = (size_t)f;
      (dst_len != 0 && ((*(char *)src_len_local == ' ' || (*(char *)src_len_local == '\t'))));
      src_len_local = src_len_local + 1) {
    dst_len = dst_len - 1;
  }
  while ((dst_len != 0 &&
         (((uVar1 = (uint)*(byte *)((dst_len - 1) + src_len_local), uVar1 - 9 < 2 || (uVar1 == 0xd))
          || (uVar1 == 0x20))))) {
    dst_len = dst_len - 1;
  }
  src_local = t;
  iVar2 = EVP_DecodedLength(&local_30,dst_len);
  if (((iVar2 == 0) || (0x7fffffff < local_30)) ||
     (iVar2 = EVP_DecodeBase64(src_local,&local_30,local_30,(uint8_t *)src_len_local,dst_len),
     iVar2 == 0)) {
    dst_local._4_4_ = -1;
  }
  else {
    while (local_30 % 3 != 0) {
      src_local[local_30] = '\0';
      local_30 = local_30 + 1;
    }
    if (0x7fffffff < local_30) {
      __assert_fail("dst_len <= INT_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/base64/base64.cc"
                    ,0x1af,"int EVP_DecodeBlock(uint8_t *, const uint8_t *, size_t)");
    }
    dst_local._4_4_ = (int)local_30;
  }
  return dst_local._4_4_;
}

Assistant:

int EVP_DecodeBlock(uint8_t *dst, const uint8_t *src, size_t src_len) {
  // Trim spaces and tabs from the beginning of the input.
  while (src_len > 0) {
    if (src[0] != ' ' && src[0] != '\t') {
      break;
    }

    src++;
    src_len--;
  }

  // Trim newlines, spaces and tabs from the end of the line.
  while (src_len > 0) {
    switch (src[src_len - 1]) {
      case ' ':
      case '\t':
      case '\r':
      case '\n':
        src_len--;
        continue;
    }

    break;
  }

  size_t dst_len;
  if (!EVP_DecodedLength(&dst_len, src_len) || dst_len > INT_MAX ||
      !EVP_DecodeBase64(dst, &dst_len, dst_len, src, src_len)) {
    return -1;
  }

  // EVP_DecodeBlock does not take padding into account, so put the
  // NULs back in... so the caller can strip them back out.
  while (dst_len % 3 != 0) {
    dst[dst_len++] = '\0';
  }
  assert(dst_len <= INT_MAX);

  return (int)dst_len;
}